

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.cpp
# Opt level: O1

void __thiscall
chrono::ChBodyEasyClusterOfSpheres::SetupBody
          (ChBodyEasyClusterOfSpheres *this,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *positions,
          vector<double,_std::allocator<double>_> *radii,double density,bool visualize,bool collide,
          shared_ptr<chrono::ChMaterialSurface> *material)

{
  undefined1 auVar1 [16];
  pointer pCVar2;
  element_type *peVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *pvVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  ChSphereShape *this_00;
  double *pdVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *shape;
  bool bVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  shared_ptr<chrono::ChSphereShape> vshape;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> offset_positions;
  ChMatrix33<double> totinertia;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_170;
  shared_ptr<chrono::ChVisualModel> local_158;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  ChMatrix33<double> local_128;
  ChQuaternion<double> local_d8;
  ChFrame<double> local_b8;
  
  if (((long)(positions->
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             )._M_impl.super__Vector_impl_data._M_finish -
       (long)(positions->
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
      ((long)(radii->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(radii->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3) != 0) {
    __assert_fail("positions.size() == radii.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChBodyEasy.cpp"
                  ,0x1ee,
                  "void chrono::ChBodyEasyClusterOfSpheres::SetupBody(std::vector<ChVector<>> &, std::vector<double> &, double, bool, bool, std::shared_ptr<ChMaterialSurface>)"
                 );
  }
  local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
  local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  dVar30 = 0.0;
  dVar6 = DAT_00b90ac8;
  dVar4 = VNULL;
  dVar5 = DAT_00b90ac0;
  if ((positions->
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish !=
      (positions->
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    uVar18 = 1;
    uVar16 = 0;
    dVar30 = 0.0;
    do {
      dVar20 = pow((radii->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar16],3.0);
      dVar20 = density * dVar20 * 4.1887902047863905;
      dVar4 = dVar30 * dVar4;
      dVar5 = dVar30 * dVar5;
      dVar6 = dVar30 * dVar6;
      pCVar2 = (positions->
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      dVar30 = dVar30 + dVar20;
      dVar21 = 1.0 / dVar30;
      dVar4 = dVar21 * (dVar4 + dVar20 * pCVar2[uVar16].m_data[0]);
      dVar5 = dVar21 * (dVar5 + dVar20 * pCVar2[uVar16].m_data[1]);
      dVar6 = dVar21 * (dVar6 + dVar20 * pCVar2[uVar16].m_data[2]);
      uVar16 = (ulong)uVar18;
      uVar17 = ((long)(positions->
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2 >> 3) *
               -0x5555555555555555;
      uVar18 = uVar18 + 1;
    } while (uVar16 <= uVar17 && uVar17 - uVar16 != 0);
  }
  if ((positions->
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish !=
      (positions->
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    uVar18 = 1;
    uVar16 = 0;
    do {
      dVar20 = pow((radii->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar16],3.0);
      dVar21 = density * dVar20 * 4.1887902047863905;
      dVar20 = (radii->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar16];
      pCVar2 = (positions->
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      dVar7 = pCVar2[uVar16].m_data[0] - dVar4;
      dVar8 = pCVar2[uVar16].m_data[1] - dVar5;
      dVar9 = pCVar2[uVar16].m_data[2] - dVar6;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar7;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = dVar8 * dVar8;
      auVar10 = vfmadd231sd_fma(auVar33,auVar26,auVar26);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar9;
      auVar11 = vfmadd231sd_fma(auVar10,auVar31,auVar31);
      dVar20 = dVar21 * 0.4 * dVar20 * dVar20;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar7;
      auVar10 = vfnmadd213sd_fma(auVar27,auVar27,auVar11);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar21;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar20;
      auVar10 = vfmadd213sd_fma(auVar10,auVar22,auVar24);
      local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           auVar10._0_8_ +
           local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = dVar8;
      auVar10 = vfnmadd213sd_fma(auVar29,auVar29,auVar11);
      auVar10 = vfmadd213sd_fma(auVar10,auVar22,auVar24);
      local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           auVar10._0_8_ +
           local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = dVar9;
      auVar10 = vfnmadd231sd_fma(auVar11,auVar32,auVar32);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar20;
      auVar10 = vfmadd213sd_fma(auVar10,auVar22,auVar25);
      local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           auVar10._0_8_ +
           local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      auVar10._8_8_ = 0;
      auVar10._0_8_ =
           local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      auVar34._8_8_ = 0;
      auVar34._0_8_ = dVar8 * dVar7;
      auVar10 = vfnmadd213sd_fma(auVar34,auVar22,auVar10);
      local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           auVar10._0_8_;
      auVar11._8_8_ = 0;
      auVar11._0_8_ =
           local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar21;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = dVar9 * dVar7;
      auVar10 = vfnmadd213sd_fma(auVar35,auVar23,auVar11);
      local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           auVar10._0_8_;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[5];
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar9 * dVar8;
      auVar10 = vfnmadd213sd_fma(auVar28,auVar23,auVar1);
      local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           auVar10._0_8_;
      uVar16 = (ulong)uVar18;
      uVar17 = ((long)(positions->
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(positions->
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      uVar18 = uVar18 + 1;
      local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           local_128.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    } while (uVar16 <= uVar17 && uVar17 - uVar16 != 0);
  }
  (this->super_ChBody).density = (float)density;
  ChVariablesBodyOwnMass::SetBodyMass(&(this->super_ChBody).variables,dVar30);
  ChBody::SetInertia(&this->super_ChBody,&local_128);
  shape = positions;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::vector
            (&local_170,positions);
  lVar12 = (long)(positions->
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(positions->
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  if (lVar12 != 0) {
    pvVar13 = (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)
              ((lVar12 >> 3) * -0x5555555555555555);
    pdVar15 = (local_170.
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_data + 2;
    uVar18 = 1;
    do {
      dVar30 = pdVar15[-1];
      ((ChVector<double> *)(pdVar15 + -2))->m_data[0] =
           ((ChVector<double> *)(pdVar15 + -2))->m_data[0] - dVar4;
      pdVar15[-1] = dVar30 - dVar5;
      *pdVar15 = *pdVar15 - dVar6;
      shape = (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)
              (ulong)uVar18;
      pdVar15 = pdVar15 + 3;
      uVar18 = uVar18 + 1;
    } while (shape <= pvVar13 && (long)pvVar13 - (long)shape != 0);
  }
  if (collide) {
    if ((material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        == (element_type *)0x0) {
      __assert_fail("material",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChBodyEasy.cpp"
                    ,0x214,
                    "void chrono::ChBodyEasyClusterOfSpheres::SetupBody(std::vector<ChVector<>> &, std::vector<double> &, double, bool, bool, std::shared_ptr<ChMaterialSurface>)"
                   );
    }
    peVar3 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var14 = (this->super_ChBody).collision_model.
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    (*peVar3->_vptr_ChCollisionModel[3])();
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
    }
    if ((positions->
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
        _M_impl.super__Vector_impl_data._M_finish !=
        (positions->
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
        _M_impl.super__Vector_impl_data._M_start) {
      uVar16 = 0;
      uVar17 = 1;
      do {
        peVar3 = (this->super_ChBody).collision_model.
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var14 = (this->super_ChBody).collision_model.
                  super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          }
        }
        local_148.
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)(material->
                      super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr;
        local_130 = (material->
                    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
        if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_130->_M_use_count = local_130->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_130->_M_use_count = local_130->_M_use_count + 1;
          }
        }
        (*peVar3->_vptr_ChCollisionModel[5])
                  (peVar3,&local_148.
                           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   local_170.
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar16);
        if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
        }
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
        uVar16 = ((long)(positions->
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(positions->
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        bVar19 = uVar17 <= uVar16;
        lVar12 = uVar16 - uVar17;
        uVar16 = uVar17;
        uVar17 = (ulong)((int)uVar17 + 1);
      } while (bVar19 && lVar12 != 0);
    }
    peVar3 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var14 = (this->super_ChBody).collision_model.
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    (*peVar3->_vptr_ChCollisionModel[4])();
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
    }
    shape = (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)0x1;
    ChBody::SetCollide(&this->super_ChBody,true);
  }
  if (visualize) {
    p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
    p_Var14->_M_use_count = 1;
    p_Var14->_M_weak_count = 1;
    p_Var14->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b33b18;
    p_Var14[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var14[1]._M_use_count = 0;
    p_Var14[1]._M_weak_count = 0;
    p_Var14[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var14[2]._M_use_count = 0;
    p_Var14[2]._M_weak_count = 0;
    p_Var14[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var14[2]._M_use_count = 0;
    p_Var14[2]._M_weak_count = 0;
    p_Var14[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var14[3]._M_use_count = 0;
    p_Var14[3]._M_weak_count = 0;
    if ((positions->
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
        _M_impl.super__Vector_impl_data._M_finish !=
        (positions->
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
        _M_impl.super__Vector_impl_data._M_start) {
      uVar18 = 1;
      uVar16 = 0;
      do {
        this_00 = (ChSphereShape *)ChVisualShape::operator_new((ChVisualShape *)0x38,(size_t)shape);
        ChSphereShape::ChSphereShape(this_00);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChSphereShape*>
                  (&local_178,this_00);
        (this_00->gsphere).rad =
             (radii->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar16];
        local_148.
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)local_178._M_pi;
        if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_178._M_pi)->_M_use_count = (local_178._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_178._M_pi)->_M_use_count = (local_178._M_pi)->_M_use_count + 1;
          }
        }
        local_d8.m_data[0] = 1.0;
        local_d8.m_data[3] = 0.0;
        local_d8.m_data[1] = 0.0;
        local_d8.m_data[2] = 0.0;
        local_b8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
        local_b8.coord.pos.m_data[0] =
             local_170.
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar16].m_data[0];
        local_b8.coord.pos.m_data[1] =
             local_170.
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar16].m_data[1];
        local_b8.coord.pos.m_data[2] =
             local_170.
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar16].m_data[2];
        local_b8.coord.rot.m_data[0] = 1.0;
        local_b8.coord.rot.m_data[3] = 0.0;
        local_b8.coord.rot.m_data[1] = 0.0;
        local_b8.coord.rot.m_data[2] = 0.0;
        local_148.
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
        ChMatrix33<double>::ChMatrix33(&local_b8.Amatrix,&local_d8);
        shape = &local_148;
        ChVisualModel::AddShape
                  ((ChVisualModel *)(p_Var14 + 1),(shared_ptr<chrono::ChVisualShape> *)shape,
                   &local_b8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_148.
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_148.
                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
        }
        uVar16 = (ulong)uVar18;
        uVar17 = ((long)(positions->
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(positions->
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        uVar18 = uVar18 + 1;
      } while (uVar16 <= uVar17 && uVar17 - uVar16 != 0);
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
    }
    local_158.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (ChVisualModel *)(p_Var14 + 1);
    local_158.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var14;
    ChPhysicsItem::AddVisualModel((ChPhysicsItem *)this,&local_158);
    if (local_158.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
  }
  if (local_170.
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_170.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ChBodyEasyClusterOfSpheres::SetupBody(std::vector<ChVector<>>& positions,
                                           std::vector<double>& radii,
                                           double density,
                                           bool visualize,
                                           bool collide,
                                           std::shared_ptr<ChMaterialSurface> material) {
    assert(positions.size() == radii.size());

    double totmass = 0;
    ChMatrix33<> totinertia;
    ChVector<> baricenter = VNULL;
    totinertia.setZero();
    for (unsigned int i = 0; i < positions.size(); ++i) {
        double sphmass = density * ((4.0 / 3.0) * CH_C_PI * pow(radii[i], 3));
        baricenter = (baricenter * totmass + positions[i] * sphmass) / (totmass + sphmass);
        totmass += sphmass;
    }
    for (unsigned int i = 0; i < positions.size(); ++i) {
        double sphmass = density * ((4.0 / 3.0) * CH_C_PI * pow(radii[i], 3));
        double sphinertia = (2.0 / 5.0) * sphmass * pow(radii[i], 2);

        // Huygens-Steiner parallel axis theorem:
        ChVector<> dist = positions[i] - baricenter;
        totinertia(0, 0) += sphinertia + sphmass * (dist.Length2() - dist.x() * dist.x());
        totinertia(1, 1) += sphinertia + sphmass * (dist.Length2() - dist.y() * dist.y());
        totinertia(2, 2) += sphinertia + sphmass * (dist.Length2() - dist.z() * dist.z());
        totinertia(0, 1) += sphmass * (-dist.x() * dist.y());
        totinertia(0, 2) += sphmass * (-dist.x() * dist.z());
        totinertia(1, 2) += sphmass * (-dist.y() * dist.z());
        totinertia(1, 0) = totinertia(0, 1);
        totinertia(2, 0) = totinertia(0, 2);
        totinertia(2, 1) = totinertia(1, 2);
    }

    this->SetDensity((float)density);
    this->SetMass(totmass);
    this->SetInertia(totinertia);

    // Translate the cluster baricenter so that body origin is also baricenter
    std::vector<ChVector<>> offset_positions = positions;
    for (unsigned int i = 0; i < positions.size(); ++i)
        offset_positions[i] -= baricenter;

    if (collide) {
        assert(material);
        GetCollisionModel()->ClearModel();
        for (unsigned int i = 0; i < positions.size(); ++i) {
            GetCollisionModel()->AddSphere(material, radii[i], offset_positions[i]);  // radius, radius, height on y
        }
        GetCollisionModel()->BuildModel();
        SetCollide(true);
    }
    if (visualize) {
        auto vmodel = chrono_types::make_shared<ChVisualModel>();
        for (unsigned int i = 0; i < positions.size(); ++i) {
            auto vshape = chrono_types::make_shared<ChSphereShape>();
            vshape->GetSphereGeometry().rad = radii[i];
            vmodel->AddShape(vshape, ChFrame<>(offset_positions[i]));
        }
        this->AddVisualModel(vmodel);
    }
}